

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

iterator * __thiscall
tcb::unicode::detail::
unicode_view<std::istreambuf_iterator<char32_t,_std::char_traits<char32_t>_>,_std::istreambuf_iterator<char32_t,_std::char_traits<char32_t>_>,_char32_t,_char32_t>
::iterator::operator++(iterator *this)

{
  byte bVar1;
  bool bVar2;
  code_point cVar3;
  undefined8 in_RCX;
  istreambuf_iterator<char32_t,_std::char_traits<char32_t>_> last;
  
  bVar1 = this->idx_ + 1;
  this->idx_ = bVar1;
  if ((this->next_chars_).size_ == (uint)bVar1) {
    bVar2 = std::operator!=(&this->first_,&this->last_);
    if (bVar2) {
      last._M_sbuf = (streambuf_type *)(ulong)(this->last_)._M_c;
      last._8_8_ = in_RCX;
      cVar3 = utf_traits<char32_t,4>::
              decode<std::istreambuf_iterator<char32_t,std::char_traits<char32_t>>,std::istreambuf_iterator<char32_t,std::char_traits<char32_t>>>
                        ((utf_traits<char32_t,4> *)&this->first_,
                         (istreambuf_iterator<char32_t,_std::char_traits<char32_t>_> *)
                         (this->last_)._M_sbuf,last);
      this->next_chars_ = (encoded_chars<char32_t>)((ulong)(uint)cVar3 | 0x100000000);
      this->idx_ = '\0';
    }
  }
  return this;
}

Assistant:

TCB_CONSTEXPR14 iterator& operator++()
        {
            if (++idx_ == next_chars_.size() && first_ != last_) {
                char32_t c = utf_traits<InCharT>::decode(first_, last_);
                next_chars_ = utf_traits<OutCharT>::encode(c);
                idx_ = 0;
            }
            return *this;
        }